

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O0

void aom_free_pyramid(ImagePyramid *pyr)

{
  pthread_mutex_t *in_RDI;
  
  if (in_RDI != (pthread_mutex_t *)0x0) {
    pthread_mutex_destroy(in_RDI);
    aom_free(pyr);
    aom_free(pyr);
    aom_free(pyr);
  }
  return;
}

Assistant:

void aom_free_pyramid(ImagePyramid *pyr) {
  if (pyr) {
#if CONFIG_MULTITHREAD
    pthread_mutex_destroy(&pyr->mutex);
#endif  // CONFIG_MULTITHREAD
    aom_free(pyr->buffer_alloc);
    aom_free(pyr->layers);
    aom_free(pyr);
  }
}